

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSession.cpp
# Opt level: O0

ResposeMessage * __thiscall tiger::trains::network::TCPSession::login(TCPSession *this)

{
  long lVar1;
  undefined4 *puVar2;
  TCPSession *pTVar3;
  size_t __n;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  socklen_t in_ECX;
  size_t __n_00;
  void *__buf;
  void *__buf_00;
  int __flags;
  undefined8 uStack_160;
  undefined4 auStack_158 [2];
  undefined4 *local_150;
  TCPSession *local_148;
  uint local_138;
  undefined4 local_134;
  int retVal;
  uint32_t cmd;
  unsigned_long __vla_expr0;
  size_t local_120;
  size_t len;
  char buffer [255];
  TCPSession *this_local;
  
  uStack_160 = 0x26272d;
  local_148 = this;
  unique0x10000205 = this;
  uVar4 = TCPClient::connect(&this->tcpClient,(int)this->servAddr,
                             (sockaddr *)(ulong)(uint)this->port,in_ECX);
  if ((uVar4 & 1) == 0) {
    this_local = (TCPSession *)0x0;
  }
  else {
    __flags = local_148->playersNum;
    uStack_160 = 0x262766;
    iVar5 = sprintf((char *)&len,"{\"name\": \"%s\", \"game\": \"%s\", \"num_players\": %d}",
                    local_148->name,local_148->gameName);
    local_120 = (size_t)iVar5;
    _retVal = local_120 + 8;
    __n_00 = local_120 + 0x17 & 0xfffffffffffffff0;
    lVar1 = -__n_00;
    local_150 = (undefined4 *)((long)auStack_158 + lVar1);
    local_134 = 1;
    __vla_expr0 = (unsigned_long)auStack_158;
    *local_150 = 1;
    *(undefined4 *)((long)auStack_158 + lVar1 + 4) = (undefined4)local_120;
    __n = local_120;
    *(undefined8 *)((long)auStack_158 + lVar1 + -8) = 0x2627d8;
    memcpy((void *)((long)&local_150 + lVar1),&len,__n);
    pTVar3 = local_148;
    puVar2 = local_150;
    __buf = (void *)(local_120 + 8);
    *(undefined8 *)((long)auStack_158 + lVar1 + -8) = 0x2627f6;
    iVar5 = (int)puVar2;
    sVar6 = send(pTVar3,iVar5,__buf,__n_00,__flags);
    pTVar3 = local_148;
    local_138 = (uint)((byte)sVar6 & 1);
    if (local_138 == 0) {
      this_local = (TCPSession *)0x0;
    }
    else {
      *(undefined8 *)((long)auStack_158 + lVar1 + -8) = 0x26282a;
      this_local = (TCPSession *)recv(pTVar3,iVar5,__buf_00,__n_00,__flags);
    }
  }
  return (ResposeMessage *)this_local;
}

Assistant:

ResposeMessage *TCPSession::login()
{

    if (!tcpClient.connect(servAddr, port))
    {
        return nullptr;
    }

    char buffer[255];

    size_t len;

    len = sprintf(buffer, "{\"name\": \"%s\", \"game\": \"%s\", \"num_players\": %d}",
                  name, gameName, playersNum);

    char sendBuffer[8+len];

    uint32_t cmd = 1;

    memcpy(sendBuffer, &cmd, 4);
    memcpy(sendBuffer + 4, &len, 4);
    memcpy(sendBuffer + 8, buffer, len);

    int retVal = send(sendBuffer, len + 8);

    if (!retVal)
        return nullptr;

    return recv();



}